

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_d7b24::getStringArray
                  (ResourceData *pResData,ResourceArray *array,UnicodeString *dest,int32_t capacity,
                  UErrorCode *errorCode)

{
  ResourceArray *pResData_00;
  UBool UVar1;
  uint32_t res;
  UnicodeString *this;
  ConstChar16Ptr local_58;
  UChar *local_50;
  UChar *s;
  int local_40;
  int32_t sLength;
  int32_t i;
  int32_t length;
  UErrorCode *errorCode_local;
  UnicodeString *pUStack_28;
  int32_t capacity_local;
  UnicodeString *dest_local;
  ResourceArray *array_local;
  ResourceData *pResData_local;
  
  _i = errorCode;
  errorCode_local._4_4_ = capacity;
  pUStack_28 = dest;
  dest_local = (UnicodeString *)array;
  array_local = (ResourceArray *)pResData;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  if (pUStack_28 == (UnicodeString *)0x0) {
    if (errorCode_local._4_4_ != 0) {
LAB_001ffbae:
      *_i = U_ILLEGAL_ARGUMENT_ERROR;
      return 0;
    }
  }
  else if (errorCode_local._4_4_ < 0) goto LAB_001ffbae;
  sLength = icu_63::ResourceArray::getSize((ResourceArray *)dest_local);
  if (sLength == 0) {
    pResData_local._4_4_ = 0;
  }
  else if (errorCode_local._4_4_ < sLength) {
    *_i = U_BUFFER_OVERFLOW_ERROR;
    pResData_local._4_4_ = sLength;
  }
  else {
    for (local_40 = 0; pResData_00 = array_local, local_40 < sLength; local_40 = local_40 + 1) {
      res = icu_63::ResourceArray::internalGetResource
                      ((ResourceArray *)dest_local,(ResourceData *)array_local,local_40);
      local_50 = res_getString_63((ResourceData *)pResData_00,res,(int32_t *)((long)&s + 4));
      if (local_50 == (UChar *)0x0) {
        *_i = U_RESOURCE_TYPE_MISMATCH;
        return 0;
      }
      this = pUStack_28 + local_40;
      icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_58,local_50);
      icu_63::UnicodeString::setTo(this,'\x01',&local_58,s._4_4_);
      icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_58);
    }
    pResData_local._4_4_ = sLength;
  }
  return pResData_local._4_4_;
}

Assistant:

int32_t getStringArray(const ResourceData *pResData, const icu::ResourceArray &array,
                       icu::UnicodeString *dest, int32_t capacity,
                       UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(dest == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t length = array.getSize();
    if(length == 0) {
        return 0;
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }
    for(int32_t i = 0; i < length; ++i) {
        int32_t sLength;
        const UChar *s = res_getString(pResData, array.internalGetResource(pResData, i), &sLength);
        if(s == NULL) {
            errorCode = U_RESOURCE_TYPE_MISMATCH;
            return 0;
        }
        dest[i].setTo(TRUE, s, sLength);
    }
    return length;
}